

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void std::
     __unguarded_linear_insert<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Val_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>>
               (undefined8 *__last)

{
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  value_type __val;
  
  uVar2 = *__last;
  __val.m_data[2] = *(float *)(__last + 1);
  __val.m_data[0] = (float)uVar2;
  do {
    if (*(float *)((long)__last + -0xc) <= __val.m_data[0]) {
      if (*(float *)((long)__last + -0xc) < __val.m_data[0]) {
LAB_003e9e20:
        *(float *)(__last + 1) = __val.m_data[2];
        *__last = uVar2;
        return;
      }
      uVar4 = 0;
      do {
        uVar3 = uVar4;
        uVar4 = uVar3;
        if (uVar3 == 2) goto LAB_003e9e00;
        fVar1 = *(float *)((long)__last + uVar3 * 4 + -8);
        if (__val.m_data[uVar3 + 1] < fVar1) {
          uVar4 = 1;
          goto LAB_003e9e00;
        }
        uVar4 = uVar3 + 1;
      } while (__val.m_data[uVar3 + 1] <= fVar1);
      uVar4 = 0;
LAB_003e9e00:
      if ((1 < uVar3) || ((uVar4 & 1) == 0)) goto LAB_003e9e20;
    }
    *(undefined4 *)(__last + 1) = *(undefined4 *)((long)__last + -4);
    *__last = *(undefined8 *)((long)__last + -0xc);
    __last = (undefined8 *)((long)__last + -0xc);
  } while( true );
}

Assistant:

inline Vector<T, Size>::Vector (const Vector<T, Size>& v)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = v.m_data[i];
}